

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

void duckdb::ReservoirQuantileListOperation<long>::
     Finalize<duckdb::list_entry_t,duckdb::ReservoirQuantileState<long>>
               (ReservoirQuantileState<long> *state,list_entry_t *target,
               AggregateFinalizeData *finalize_data)

{
  Vector *pVVar1;
  ReservoirQuantileBindData *pRVar2;
  vector<double,_true> *this;
  size_type sVar3;
  long *plVar4;
  reference pvVar5;
  long lVar6;
  ulong uVar7;
  undefined8 *in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  double dVar8;
  undefined1 auVar9 [16];
  idx_t offset;
  value_type *quantile;
  size_t q;
  list_entry_t *entry;
  long *v_t;
  long *rdata;
  idx_t ridx;
  Vector *result;
  ReservoirQuantileBindData *bind_data;
  size_type in_stack_ffffffffffffff88;
  FunctionData *in_stack_ffffffffffffff90;
  long *__last;
  long *__first;
  AggregateFinalizeData *in_stack_ffffffffffffffd0;
  vector<double,_true> *pvVar10;
  
  if (in_RDI[2] == 0) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffffd0);
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffff90);
    pRVar2 = FunctionData::Cast<duckdb::ReservoirQuantileBindData>(in_stack_ffffffffffffff90);
    duckdb::ListVector::GetEntry((Vector *)*in_RDX);
    this = (vector<double,_true> *)duckdb::ListVector::GetListSize((Vector *)*in_RDX);
    pVVar1 = (Vector *)*in_RDX;
    pvVar10 = this;
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      (&(pRVar2->quantiles).super_vector<double,_std::allocator<double>_>);
    duckdb::ListVector::Reserve
              (pVVar1,(long)&(this->super_vector<double,_std::allocator<double>_>).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + sVar3);
    plVar4 = FlatVector::GetData<long>((Vector *)0xac35be);
    __first = (long *)*in_RDI;
    *in_RSI = (long)pvVar10;
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      (&(pRVar2->quantiles).super_vector<double,_std::allocator<double>_>);
    in_RSI[1] = sVar3;
    for (__last = (long *)0x0; __last < (long *)in_RSI[1]; __last = (long *)((long)__last + 1)) {
      pvVar5 = vector<double,_true>::operator[](this,in_stack_ffffffffffffff88);
      lVar6 = in_RDI[2] + -1;
      auVar9._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar9._0_8_ = lVar6;
      auVar9._12_4_ = 0x45300000;
      dVar8 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) * *pvVar5;
      uVar7 = (ulong)dVar8;
      std::nth_element<long*>(__first,in_RSI,__last);
      plVar4[(long)&(pvVar10->super_vector<double,_std::allocator<double>_>).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + (long)__last] =
           __first[uVar7 | (long)(dVar8 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f];
    }
    duckdb::ListVector::SetListSize((Vector *)*in_RDX,*in_RSI + in_RSI[1]);
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ReservoirQuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v;
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		entry.length = bind_data.quantiles.size();
		for (size_t q = 0; q < entry.length; ++q) {
			const auto &quantile = bind_data.quantiles[q];
			auto offset = (idx_t)((double)(state.pos - 1) * quantile);
			std::nth_element(v_t, v_t + offset, v_t + state.pos);
			rdata[ridx + q] = v_t[offset];
		}

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}